

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::scrollRect(QWidgetPrivate *this,QRect *rect,int dx,int dy)

{
  undefined4 uVar1;
  QWidget *this_00;
  long lVar2;
  QWidgetRepaintManager *this_01;
  undefined4 uVar4;
  QWidgetData *pQVar3;
  undefined1 auVar5 [16];
  QRect QVar6;
  QRect QVar7;
  bool bVar8;
  char cVar9;
  Representation RVar10;
  int iVar11;
  QWidget *parent;
  QWidget *pQVar12;
  Representation RVar13;
  QRect *this_02;
  int iVar14;
  long in_FS_OFFSET;
  QRegion dirtyScrollRegion;
  QRegion childExpose;
  QRegion region;
  undefined1 local_80 [8];
  undefined1 local_78 [16];
  undefined8 local_68;
  QPoint local_60;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  parent = QWidget::window(this_00);
  pQVar12 = QWidget::window(*(QWidget **)(*(long *)&parent->field_0x8 + 8));
  QVar7.x2.m_i = local_48.x2.m_i;
  QVar7.y2.m_i = local_48.y2.m_i;
  QVar7.x1.m_i = local_48.x1.m_i;
  QVar7.y1.m_i = local_48.y1.m_i;
  QVar6.x2.m_i = local_48.x2.m_i;
  QVar6.y2.m_i = local_48.y2.m_i;
  QVar6.x1.m_i = local_48.x1.m_i;
  QVar6.y1.m_i = local_48.y1.m_i;
  lVar2 = *(long *)(*(long *)&pQVar12->field_0x8 + 0x78);
  if (((lVar2 != 0) && (lVar2 = *(long *)(lVar2 + 8), local_48 = QVar6, lVar2 != 0)) &&
     (this_01 = *(QWidgetRepaintManager **)(lVar2 + 8), local_48 = QVar7,
     this_01 != (QWidgetRepaintManager *)0x0)) {
    if (scrollRect(QRect_const&,int,int)::accelEnv == '\0') {
      scrollRect();
    }
    local_58 = clipRect(this);
    local_48 = (QRect)QRect::operator&(rect,&local_58);
    if ((scrollRect::accelEnv == true) && ((this->field_0x252 & 2) != 0)) {
      bVar8 = QWidget::testAttribute_helper(*(QWidget **)&this->field_0x8,WA_WState_InPaintEvent);
      if (!bVar8) {
        uVar1 = (this->data).crect.x1;
        uVar4 = (this->data).crect.y1;
        local_58.x1.m_i = local_48.x1.m_i + uVar1;
        local_58.y1.m_i = local_48.y1.m_i + uVar4;
        local_58._8_8_ = CONCAT44(uVar4 + local_48.y2.m_i,local_48.x2.m_i + uVar1);
        bVar8 = isOverlapped(this,&local_58);
        if (bVar8) {
          this_02 = &local_58;
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion((QRegion *)this_02,&local_48,Rectangle);
          subtractOpaqueSiblings(this,(QRegion *)this_02,(bool *)0x0,false);
          invalidateBackingStore<QRegion>(this,(QRegion *)this_02);
        }
        else {
          auVar5._8_8_ = 0;
          auVar5._0_4_ = local_58.x2.m_i;
          auVar5._4_4_ = local_58.y2.m_i;
          local_58 = (QRect)(auVar5 << 0x40);
          local_60 = QWidget::mapTo(this_00,parent,(QPoint *)&local_58);
          local_78._8_4_ = local_48.x1.m_i + dx;
          local_78._12_4_ = local_48.y1.m_i + dy;
          local_68 = CONCAT44(local_48.y2.m_i + dy,local_48.x2.m_i + dx);
          local_58 = (QRect)QRect::operator&((QRect *)(local_78 + 8),&local_48);
          RVar13.m_i = local_58.x1.m_i.m_i - dx;
          RVar10.m_i = local_58.y1.m_i.m_i - dy;
          iVar11 = local_58.x2.m_i.m_i - dx;
          iVar14 = local_58.y2.m_i.m_i - dy;
          local_78._12_4_ = RVar10.m_i;
          local_78._8_4_ = RVar13.m_i;
          local_68 = CONCAT44(iVar14,iVar11);
          local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion((QRegion *)local_78,&local_48,Rectangle);
          if (RVar10.m_i <= iVar14 && RVar13.m_i <= iVar11) {
            bVar8 = QWidgetRepaintManager::bltRect(this_01,(QRect *)(local_78 + 8),dx,dy,this_00);
            if (bVar8) {
              QRegion::QRegion((QRegion *)local_80,&local_58,Rectangle);
              QRegion::operator-=((QRegion *)local_78,(QRegion *)local_80);
              QRegion::~QRegion((QRegion *)local_80);
            }
          }
          if ((this->field_0x252 & 8) != 0) {
            if ((((rect->x1).m_i == 0) &&
                (pQVar3 = this_00->data,
                (rect->x2).m_i == (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i)) &&
               (((rect->y1).m_i == 0 &&
                ((rect->y2).m_i == (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i)))) {
              QRegion::translate((int)this + 0xe0,dx);
            }
            else {
              local_80 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
              QRegion::intersected((QRect *)local_80);
              cVar9 = QRegion::isEmpty();
              if (cVar9 == '\0') {
                QRegion::operator-=(&this->dirty,(QRegion *)local_80);
                QRegion::translate((int)(QRegion *)local_80,dx);
                QRegion::operator+=(&this->dirty,(QRegion *)local_80);
              }
              QRegion::~QRegion((QRegion *)local_80);
            }
          }
          if ((this_00->data->widget_attributes & 0x400) == 0) {
            cVar9 = QRegion::isEmpty();
            if (cVar9 == '\0') {
              QWidgetRepaintManager::markDirty<QRegion>
                        (this_01,(QRegion *)local_78,this_00,UpdateLater,BufferValid);
              this->field_0x252 = this->field_0x252 | 0x10;
            }
            QRegion::QRegion((QRegion *)local_80,&local_58,Rectangle);
            QWidgetRepaintManager::markNeedsFlush(this_01,this_00,(QRegion *)local_80,&local_60);
            QRegion::~QRegion((QRegion *)local_80);
          }
          this_02 = (QRect *)local_78;
        }
        QRegion::~QRegion((QRegion *)this_02);
        goto LAB_0031a1a0;
      }
    }
    invalidateBackingStore<QRect>(this,&local_48);
  }
LAB_0031a1a0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::scrollRect(const QRect &rect, int dx, int dy)
{
    Q_Q(QWidget);
    QWidget *tlw = q->window();

    QWidgetRepaintManager *repaintManager = QWidgetPrivate::get(tlw)->maybeRepaintManager();
    if (!repaintManager)
        return;

    static const bool accelEnv = qEnvironmentVariableIntValue("QT_NO_FAST_SCROLL") == 0;

    const QRect scrollRect = rect & clipRect();
    bool overlapped = false;
    bool accelerateScroll = accelEnv && isOpaque && !q_func()->testAttribute(Qt::WA_WState_InPaintEvent)
                            && !(overlapped = isOverlapped(scrollRect.translated(data.crect.topLeft())));

    if (!accelerateScroll) {
        if (overlapped) {
            QRegion region(scrollRect);
            subtractOpaqueSiblings(region);
            invalidateBackingStore(region);
        }else {
            invalidateBackingStore(scrollRect);
        }
    } else {
        const QPoint toplevelOffset = q->mapTo(tlw, QPoint());
        const QRect destRect = scrollRect.translated(dx, dy) & scrollRect;
        const QRect sourceRect = destRect.translated(-dx, -dy);

        QRegion childExpose(scrollRect);
        if (sourceRect.isValid()) {
            if (repaintManager->bltRect(sourceRect, dx, dy, q))
                childExpose -= destRect;
        }

        if (inDirtyList) {
            if (rect == q->rect()) {
                dirty.translate(dx, dy);
            } else {
                QRegion dirtyScrollRegion = dirty.intersected(scrollRect);
                if (!dirtyScrollRegion.isEmpty()) {
                    dirty -= dirtyScrollRegion;
                    dirtyScrollRegion.translate(dx, dy);
                    dirty += dirtyScrollRegion;
                }
            }
        }

        if (!q->updatesEnabled())
            return;

        if (!childExpose.isEmpty()) {
            repaintManager->markDirty(childExpose, q);
            isScrolled = true;
        }

        // Instead of using native scroll-on-screen, we copy from
        // backingstore, giving only one screen update for each
        // scroll, and a solid appearance
        repaintManager->markNeedsFlush(q, destRect, toplevelOffset);
    }
}